

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void printISOTime(char *buffer,size_t buffer_len)

{
  size_t sVar1;
  size_t in_RSI;
  char *in_RDI;
  size_t offset_len;
  char tz_offset_str [6];
  size_t milli;
  timeval cur_time;
  size_t time_len;
  time_t rawtime;
  tm *tm_now;
  char local_46 [3];
  char acStack_43 [3];
  ulong local_40;
  timeval local_38;
  size_t local_28;
  time_t local_20;
  tm *local_18;
  size_t local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  time(&local_20);
  local_18 = localtime(&local_20);
  local_28 = strftime(local_8,local_10,"%Y-%m-%dT%H:%M:%S",local_18);
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  local_40 = local_38.tv_usec / 1000;
  sprintf(local_8 + local_28,".%03d",local_40 & 0xffffffff);
  local_28 = local_28 + 4;
  sVar1 = strftime(local_46,6,"%z",local_18);
  if (4 < sVar1) {
    strncat(local_8,local_46,3);
    strcat(local_8,":");
    strncat(local_8,acStack_43,2);
  }
  return;
}

Assistant:

void printISOTime(char* buffer, size_t buffer_len) {
    struct tm* tm_now;
    time_t rawtime;
    time(&rawtime);
    tm_now = localtime(&rawtime);

    // 2017-06-22T10:00:00
    size_t time_len = strftime(buffer, buffer_len,
                               "%Y-%m-%dT%H:%M:%S", tm_now);

    // Add milliseconds
    timeval cur_time;
    gettimeofday(&cur_time, NULL);
    size_t milli = cur_time.tv_usec / 1000;
    // 2017-06-22T10:00:00.123
    sprintf(buffer + time_len, ".%03d", (int)milli);
    time_len += 4;

    // timezone offset format: -0500
    char tz_offset_str[6];
    size_t offset_len =  strftime(tz_offset_str, 6,
                                  "%z", tm_now);
    if (offset_len < 5) {
        // Time zone info is not supported, skip it.
        return;
    }

    // hour
    strncat(buffer, tz_offset_str, 3);
    // :
    strcat(buffer, ":");
    // min
    strncat(buffer, tz_offset_str + 3, 2);
    // final format: 2017-06-22T10:00:00.123-05:00
}